

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWhileCommand.cxx
# Opt level: O0

void __thiscall
cmWhileFunctionBlocker::cmWhileFunctionBlocker(cmWhileFunctionBlocker *this,cmMakefile *mf)

{
  cmMakefile *mf_local;
  cmWhileFunctionBlocker *this_local;
  
  cmFunctionBlocker::cmFunctionBlocker(&this->super_cmFunctionBlocker);
  (this->super_cmFunctionBlocker)._vptr_cmFunctionBlocker =
       (_func_int **)&PTR_IsFunctionBlocked_00bc32a0;
  std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::vector(&this->Args);
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::vector(&this->Functions);
  this->Makefile = mf;
  this->Depth = 0;
  cmMakefile::PushLoopBlock(this->Makefile);
  return;
}

Assistant:

cmWhileFunctionBlocker::cmWhileFunctionBlocker(cmMakefile* mf)
  : Makefile(mf)
  , Depth(0)
{
  this->Makefile->PushLoopBlock();
}